

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtCore.c
# Opt level: O1

int Cgt_ClockGatingRange(Cgt_Man_t *p,int iStart)

{
  uint uVar1;
  int iVar2;
  Aig_Man_t *p_00;
  Cnf_Dat_t *p_01;
  sat_solver *s;
  void **ppvVar3;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  void **ppvVar7;
  int iVar8;
  long lVar9;
  timespec ts;
  int nOutputs;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  uint local_3c;
  long local_38;
  
  iVar2 = clock_gettime(3,(timespec *)&ts);
  lVar9 = 1;
  local_38 = 1;
  if (-1 < iVar2) {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    local_38 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  local_48 = p->nCallsSat;
  local_4c = p->nCallsUnsat;
  local_44 = p->nCallsUndec;
  local_40 = p->nCallsFiltered;
  iVar2 = clock_gettime(3,(timespec *)&ts);
  if (-1 < iVar2) {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  p_00 = Cgt_ManDupPartition(p->pFrame,p->pPars->nVarsMin,p->pPars->nFlopsMin,iStart,p->pCare,
                             p->vSuppsInv,&nOutputs);
  p->pPart = p_00;
  p_01 = Cnf_DeriveSimple(p_00,nOutputs);
  p->pCnf = p_01;
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_01,1,0);
  p->pSat = s;
  if (s->qtail != s->qhead) {
    iVar2 = sat_solver_simplify(s);
    if (iVar2 == 0) {
      __assert_fail("RetValue != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                    ,0x102,"void sat_solver_compress(sat_solver *)");
    }
  }
  iVar2 = p->pPart->vObjs->nSize;
  lVar6 = (long)iVar2;
  iVar8 = p->nPattWords;
  local_3c = iStart;
  ppvVar3 = (void **)malloc(((long)iVar8 * 4 + 8) * lVar6);
  if (0 < lVar6) {
    ppvVar4 = ppvVar3 + lVar6;
    ppvVar7 = ppvVar3;
    do {
      *ppvVar7 = ppvVar4;
      ppvVar7 = ppvVar7 + 1;
      ppvVar4 = (void **)((long)ppvVar4 + (long)iVar8 * 4);
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nSize = iVar2;
  pVVar5->nCap = iVar2;
  pVVar5->pArray = ppvVar3;
  p->vPatts = pVVar5;
  if (0 < iVar2) {
    lVar6 = 0;
    do {
      memset(pVVar5->pArray[lVar6],0,(long)(iVar8 << 2));
      lVar6 = lVar6 + 1;
    } while (lVar6 < pVVar5->nSize);
  }
  iVar2 = clock_gettime(3,(timespec *)&ts);
  uVar1 = local_3c;
  if (iVar2 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  p->timePrepare = p->timePrepare + lVar6 + lVar9;
  Cgt_ClockGatingRangeCheck(p,local_3c,nOutputs);
  if (p->pPars->fVeryVerbose != 0) {
    iVar2 = 0x9e73da;
    printf("%5d : D =%4d. C =%5d. Var =%6d. Pr =%5d. Cex =%5d. F =%4d. Saved =%6d. ",(ulong)uVar1,
           (ulong)(uint)nOutputs,(ulong)(uint)(p->pPart->nObjs[3] - nOutputs),
           (ulong)(uint)p->pSat->size,(ulong)(uint)(p->nCallsUnsat - local_4c),
           (ulong)(uint)(p->nCallsSat - local_48),(ulong)(uint)(p->nCallsUndec - local_44),
           (ulong)(uint)(p->nCallsFiltered - local_40));
    Abc_Print(iVar2,"%s =","Time");
    iVar8 = 3;
    iVar2 = clock_gettime(3,(timespec *)&ts);
    if (iVar2 < 0) {
      lVar9 = -1;
    }
    else {
      lVar9 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    Abc_Print(iVar8,"%9.2f sec\n",(double)(lVar9 + local_38) / 1000000.0);
  }
  Cgt_ManClean(p);
  p->nRecycles = p->nRecycles + 1;
  return nOutputs + uVar1;
}

Assistant:

int Cgt_ClockGatingRange( Cgt_Man_t * p, int iStart )
{
    int nOutputs, iStop;
    abctime clk, clkTotal = Abc_Clock();
    int nCallsUnsat    = p->nCallsUnsat;
    int nCallsSat      = p->nCallsSat;
    int nCallsUndec    = p->nCallsUndec;
    int nCallsFiltered = p->nCallsFiltered;
clk = Abc_Clock();
    p->pPart = Cgt_ManDupPartition( p->pFrame, p->pPars->nVarsMin, p->pPars->nFlopsMin, iStart, p->pCare, p->vSuppsInv, &nOutputs );
    p->pCnf  = Cnf_DeriveSimple( p->pPart, nOutputs );
    p->pSat  = (sat_solver *)Cnf_DataWriteIntoSolver( p->pCnf, 1, 0 );
    sat_solver_compress( p->pSat );
    p->vPatts = Vec_PtrAllocSimInfo( Aig_ManObjNumMax(p->pPart), p->nPattWords );
    Vec_PtrCleanSimInfo( p->vPatts, 0, p->nPattWords );
p->timePrepare += Abc_Clock() - clk;
    Cgt_ClockGatingRangeCheck( p, iStart, nOutputs );
    iStop = iStart + nOutputs;
    if ( p->pPars->fVeryVerbose )
    {
        printf( "%5d : D =%4d. C =%5d. Var =%6d. Pr =%5d. Cex =%5d. F =%4d. Saved =%6d. ",
            iStart, iStop-iStart, Aig_ManCoNum(p->pPart)-nOutputs, p->pSat->size, 
            p->nCallsUnsat-nCallsUnsat, 
            p->nCallsSat  -nCallsSat, 
            p->nCallsUndec-nCallsUndec,
            p->nCallsFiltered-nCallsFiltered );
        ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    Cgt_ManClean( p );
    p->nRecycles++;
    return iStop;
}